

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::_PathArcToFastEx
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_sample,int a_max_sample,int a_step
          )

{
  ImVec2 IVar1;
  ImDrawListSharedData *pIVar2;
  bool bVar3;
  ImVec2 IVar4;
  uint uVar5;
  uint uVar6;
  ImVec2 *pIVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int a;
  ImVec2 *pIVar14;
  ImVec2 IVar15;
  ImVec2 IVar16;
  
  if (radius < 0.5) {
    iVar13 = (this->_Path).Size;
    iVar12 = (this->_Path).Capacity;
    if (iVar13 == iVar12) {
      iVar13 = iVar13 + 1;
      if (iVar12 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar12 / 2 + iVar12;
      }
      if (iVar13 < iVar8) {
        iVar13 = iVar8;
      }
      if (iVar12 < iVar13) {
        pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar13 << 3);
        pIVar14 = (this->_Path).Data;
        if (pIVar14 != (ImVec2 *)0x0) {
          memcpy(pIVar7,pIVar14,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar7;
        (this->_Path).Capacity = iVar13;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  else {
    if (a_step < 1) {
      uVar5 = _CalcCircleAutoSegmentCount(this,radius);
      a_step = (int)(0x30 / (ulong)uVar5);
    }
    uVar5 = 0xc;
    if (a_step < 0xc) {
      uVar5 = a_step;
    }
    if (a_step == 0) {
      uVar5 = 1;
    }
    uVar6 = a_max_sample - a_min_sample;
    uVar10 = -uVar6;
    if (0 < (int)uVar6) {
      uVar10 = uVar6;
    }
    uVar6 = uVar5;
    if (uVar5 < 2) {
      iVar13 = uVar10 + 1;
      bVar3 = false;
      uVar6 = 1;
    }
    else {
      uVar11 = uVar10 % uVar5;
      bVar3 = uVar11 != 0;
      if (uVar11 == 0) {
        iVar13 = uVar10 / uVar5 + 1;
      }
      else {
        iVar13 = uVar10 / uVar5 + 2;
        bVar3 = true;
        if (a_max_sample != a_min_sample) {
          uVar6 = uVar5 - (int)(uVar5 - uVar11) / 2;
        }
      }
    }
    iVar12 = (this->_Path).Size;
    iVar13 = iVar13 + iVar12;
    iVar8 = (this->_Path).Capacity;
    if (iVar8 < iVar13) {
      if (iVar8 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar8 / 2 + iVar8;
      }
      if (iVar9 <= iVar13) {
        iVar9 = iVar13;
      }
      if (iVar8 < iVar9) {
        pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
        pIVar14 = (this->_Path).Data;
        if (pIVar14 != (ImVec2 *)0x0) {
          memcpy(pIVar7,pIVar14,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar7;
        (this->_Path).Capacity = iVar9;
      }
    }
    (this->_Path).Size = iVar13;
    iVar13 = a_min_sample;
    if (0x2f < (uint)a_min_sample) {
      iVar13 = ((uint)(a_min_sample / 6 + (a_min_sample >> 0x1f)) >> 3) - (a_min_sample >> 0x1f);
      iVar8 = a_min_sample + iVar13 * -0x30;
      iVar13 = a_min_sample + 0x30 + iVar13 * -0x30;
      if (-1 < iVar8) {
        iVar13 = iVar8;
      }
    }
    pIVar14 = (this->_Path).Data + iVar12;
    pIVar2 = this->_Data;
    if (a_max_sample < a_min_sample) {
      do {
        iVar12 = iVar13 + 0x30;
        if (-1 < iVar13) {
          iVar12 = iVar13;
        }
        IVar1 = pIVar2->ArcFastVtx[iVar12];
        IVar15.x = (*center).x + IVar1.x * radius;
        IVar15.y = (*center).y + IVar1.y * radius;
        *pIVar14 = IVar15;
        pIVar14 = pIVar14 + 1;
        a_min_sample = a_min_sample - uVar6;
        iVar13 = iVar12 - uVar6;
        uVar6 = uVar5;
      } while (a_max_sample <= a_min_sample);
    }
    else {
      do {
        iVar12 = iVar13 + -0x30;
        if (iVar13 < 0x30) {
          iVar12 = iVar13;
        }
        IVar1 = pIVar2->ArcFastVtx[iVar12];
        IVar16.x = (*center).x + IVar1.x * radius;
        IVar16.y = (*center).y + IVar1.y * radius;
        *pIVar14 = IVar16;
        pIVar14 = pIVar14 + 1;
        a_min_sample = a_min_sample + uVar6;
        iVar13 = iVar12 + uVar6;
        uVar6 = uVar5;
      } while (a_min_sample <= a_max_sample);
    }
    if (bVar3) {
      iVar13 = ((uint)(a_max_sample / 6 + (a_max_sample >> 0x1f)) >> 3) - (a_max_sample >> 0x1f);
      uVar10 = a_max_sample + iVar13 * -0x30;
      uVar5 = a_max_sample + 0x30 + iVar13 * -0x30;
      if (-1 < (int)uVar10) {
        uVar5 = uVar10;
      }
      IVar1 = this->_Data->ArcFastVtx[uVar5];
      IVar4.y = radius * IVar1.y + (*center).y;
      IVar4.x = radius * IVar1.x + (*center).x;
      *pIVar14 = IVar4;
    }
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToFastEx(const ImVec2& center, float radius, int a_min_sample, int a_max_sample, int a_step)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    // Calculate arc auto segment step size
    if (a_step <= 0)
        a_step = IM_DRAWLIST_ARCFAST_SAMPLE_MAX / _CalcCircleAutoSegmentCount(radius);

    // Make sure we never do steps larger than one quarter of the circle
    a_step = ImClamp(a_step, 1, IM_DRAWLIST_ARCFAST_TABLE_SIZE / 4);

    const int sample_range = ImAbs(a_max_sample - a_min_sample);
    const int a_next_step = a_step;

    int samples = sample_range + 1;
    bool extra_max_sample = false;
    if (a_step > 1)
    {
        samples            = sample_range / a_step + 1;
        const int overstep = sample_range % a_step;

        if (overstep > 0)
        {
            extra_max_sample = true;
            samples++;

            // When we have overstep to avoid awkwardly looking one long line and one tiny one at the end,
            // distribute first step range evenly between them by reducing first step size.
            if (sample_range > 0)
                a_step -= (a_step - overstep) / 2;
        }
    }

    _Path.resize(_Path.Size + samples);
    ImVec2* out_ptr = _Path.Data + (_Path.Size - samples);

    int sample_index = a_min_sample;
    if (sample_index < 0 || sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
    {
        sample_index = sample_index % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (sample_index < 0)
            sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
    }

    if (a_max_sample >= a_min_sample)
    {
        for (int a = a_min_sample; a <= a_max_sample; a += a_step, sample_index += a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
                sample_index -= IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }
    else
    {
        for (int a = a_min_sample; a >= a_max_sample; a -= a_step, sample_index -= a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index < 0)
                sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }

    if (extra_max_sample)
    {
        int normalized_max_sample = a_max_sample % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (normalized_max_sample < 0)
            normalized_max_sample += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

        const ImVec2 s = _Data->ArcFastVtx[normalized_max_sample];
        out_ptr->x = center.x + s.x * radius;
        out_ptr->y = center.y + s.y * radius;
        out_ptr++;
    }

    IM_ASSERT_PARANOID(_Path.Data + _Path.Size == out_ptr);
}